

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_environment.cpp
# Opt level: O0

void S_UnloadReverbDef(void)

{
  ReverbContainer *pRVar1;
  ReverbContainer *next;
  ReverbContainer **pNext;
  ReverbContainer *probe;
  
  pNext = &Environments->Next;
  next = (ReverbContainer *)0x0;
  pRVar1 = (ReverbContainer *)pNext;
  while (pNext = &pRVar1->Next, pNext != (ReverbContainer **)0x0) {
    pRVar1 = *pNext;
    if ((*(byte *)((long)pNext + 0x12) & 1) == 0) {
      if (next != (ReverbContainer *)0x0) {
        next->Next = *pNext;
      }
      if (pNext[1] != (ReverbContainer *)0x0) {
        operator_delete__(pNext[1]);
      }
      if (pNext != (ReverbContainer **)0x0) {
        operator_delete(pNext,0x98);
      }
    }
    else {
      next = (ReverbContainer *)pNext;
    }
  }
  Environments = &Off;
  return;
}

Assistant:

void S_UnloadReverbDef ()
{
	ReverbContainer *probe = Environments;
	ReverbContainer **pNext = NULL;

	while (probe != NULL)
	{
		ReverbContainer *next = probe->Next;
		if (!probe->Builtin)
		{
			if (pNext != NULL) *pNext = probe->Next;
			delete[] const_cast<char *>(probe->Name);
			delete probe;
		}
		else
		{
			pNext = &probe->Next;
		}
		probe = next;
	}
	Environments = &Off;
}